

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.hpp
# Opt level: O0

void duckdb::NumericStats::UpdateValue<duckdb::hugeint_t>
               (hugeint_t new_value,hugeint_t *min,hugeint_t *max)

{
  bool bVar1;
  undefined8 *in_RCX;
  hugeint_t *in_RDX;
  hugeint_t *in_RDI;
  hugeint_t *in_stack_ffffffffffffffc8;
  hugeint_t *in_stack_ffffffffffffffd0;
  undefined8 *puVar2;
  hugeint_t *local_28;
  
  bVar1 = LessThan::Operation<duckdb::hugeint_t>
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_28 = in_RDX;
  if (bVar1) {
    local_28 = (hugeint_t *)&stack0xfffffffffffffff0;
  }
  in_RDX->lower = local_28->lower;
  in_RDX->upper = local_28->upper;
  bVar1 = GreaterThan::Operation<duckdb::hugeint_t>(in_RDI,in_RDX);
  puVar2 = in_RCX;
  if (bVar1) {
    puVar2 = (undefined8 *)&stack0xfffffffffffffff0;
  }
  *in_RCX = *puVar2;
  in_RCX[1] = puVar2[1];
  return;
}

Assistant:

static inline void UpdateValue(T new_value, T &min, T &max) {
		min = LessThan::Operation(new_value, min) ? new_value : min;
		max = GreaterThan::Operation(new_value, max) ? new_value : max;
	}